

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O1

void Vec_StrPutF(Vec_Str_t *vOut,float Val)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  
  uVar1 = vOut->nCap;
  if (vOut->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,0x10);
      }
      vOut->pArray = pcVar3;
      sVar4 = 0x10;
    }
    else {
      sVar4 = (ulong)uVar1 * 2;
      if ((int)sVar4 <= (int)uVar1) goto LAB_0049bae7;
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar4);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,sVar4);
      }
      vOut->pArray = pcVar3;
    }
    vOut->nCap = (int)sVar4;
  }
LAB_0049bae7:
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  vOut->pArray[iVar2] = SUB41(Val,0);
  uVar1 = vOut->nCap;
  if (vOut->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,0x10);
      }
      sVar4 = 0x10;
    }
    else {
      sVar4 = (ulong)uVar1 * 2;
      if ((int)sVar4 <= (int)uVar1) goto LAB_0049bb5d;
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar4);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,sVar4);
      }
    }
    vOut->pArray = pcVar3;
    vOut->nCap = (int)sVar4;
  }
LAB_0049bb5d:
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  vOut->pArray[iVar2] = (char)((uint)Val >> 8);
  uVar1 = vOut->nCap;
  if (vOut->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,0x10);
      }
      sVar4 = 0x10;
    }
    else {
      sVar4 = (ulong)uVar1 * 2;
      if ((int)sVar4 <= (int)uVar1) goto LAB_0049bbd3;
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar4);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,sVar4);
      }
    }
    vOut->pArray = pcVar3;
    vOut->nCap = (int)sVar4;
  }
LAB_0049bbd3:
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  vOut->pArray[iVar2] = (char)((uint)Val >> 0x10);
  uVar1 = vOut->nCap;
  if (vOut->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,0x10);
      }
      sVar4 = 0x10;
    }
    else {
      sVar4 = (ulong)uVar1 * 2;
      if ((int)sVar4 <= (int)uVar1) goto LAB_0049bc3e;
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar4);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,sVar4);
      }
    }
    vOut->pArray = pcVar3;
    vOut->nCap = (int)sVar4;
  }
LAB_0049bc3e:
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  vOut->pArray[iVar2] = (char)((uint)Val >> 0x18);
  return;
}

Assistant:

static inline void Vec_StrPutF( Vec_Str_t * vOut, float Val )
{
    union { float num; unsigned char data[4]; } tmp;
    tmp.num = Val;
    Vec_StrPush( vOut, tmp.data[0] );
    Vec_StrPush( vOut, tmp.data[1] );
    Vec_StrPush( vOut, tmp.data[2] );
    Vec_StrPush( vOut, tmp.data[3] );
}